

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_create_local_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint64 uncomp_size,mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,
                  mz_uint16 bit_flags,mz_uint16 dos_time,mz_uint16 dos_date)

{
  mz_uint8 mVar1;
  mz_uint64 local_100;
  mz_uint64 local_f0;
  mz_uint64 comp_size_local;
  mz_uint64 uncomp_size_local;
  mz_uint16 extra_size_local;
  mz_uint16 filename_size_local;
  mz_uint8 *pDst_local;
  mz_zip_archive *pZip_local;
  
  memset(pDst,0,0x1e);
  builtin_memcpy(pDst,"PK\x03\x04",4);
  mVar1 = '\0';
  if (method != 0) {
    mVar1 = '\x14';
  }
  pDst[4] = mVar1;
  pDst[5] = '\0';
  *(mz_uint16 *)(pDst + 6) = bit_flags;
  *(mz_uint16 *)(pDst + 8) = method;
  *(mz_uint16 *)(pDst + 10) = dos_time;
  *(mz_uint16 *)(pDst + 0xc) = dos_date;
  pDst[0xe] = (mz_uint8)uncomp_crc32;
  pDst[0xf] = (mz_uint8)(uncomp_crc32 >> 8);
  pDst[0x10] = (mz_uint8)(uncomp_crc32 >> 0x10);
  pDst[0x11] = (mz_uint8)(uncomp_crc32 >> 0x18);
  local_f0 = comp_size;
  if (0xfffffffe < comp_size) {
    local_f0 = 0xffffffff;
  }
  pDst[0x12] = (mz_uint8)local_f0;
  pDst[0x13] = (mz_uint8)(local_f0 >> 8);
  pDst[0x14] = (mz_uint8)(local_f0 >> 0x10);
  pDst[0x15] = (mz_uint8)(local_f0 >> 0x18);
  local_100 = uncomp_size;
  if (0xfffffffe < uncomp_size) {
    local_100 = 0xffffffff;
  }
  pDst[0x16] = (mz_uint8)local_100;
  pDst[0x17] = (mz_uint8)(local_100 >> 8);
  pDst[0x18] = (mz_uint8)(local_100 >> 0x10);
  pDst[0x19] = (mz_uint8)(local_100 >> 0x18);
  *(mz_uint16 *)(pDst + 0x1a) = filename_size;
  *(mz_uint16 *)(pDst + 0x1c) = extra_size;
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_create_local_dir_header(mz_zip_archive *pZip, mz_uint8 *pDst, mz_uint16 filename_size, mz_uint16 extra_size, mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date)
{
    (void)pZip;
    memset(pDst, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE);
    MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_SIG_OFS, MZ_ZIP_LOCAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_VERSION_NEEDED_OFS, method ? 20 : 0);
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_BIT_FLAG_OFS, bit_flags);
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_METHOD_OFS, method);
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_TIME_OFS, dos_time);
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_DATE_OFS, dos_date);
    MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_CRC32_OFS, uncomp_crc32);
    MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS, MZ_MIN(comp_size, MZ_UINT32_MAX));
    MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS, MZ_MIN(uncomp_size, MZ_UINT32_MAX));
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILENAME_LEN_OFS, filename_size);
    MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_EXTRA_LEN_OFS, extra_size);
    return MZ_TRUE;
}